

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

void __thiscall Thread::Start(Thread *this)

{
  ostream *poVar1;
  LogMessage local_190;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  if ((this->running_ & 1U) != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x18);
    poVar1 = LogMessage::stream(&local_190);
    std::operator<<(poVar1,"Check failed: !running_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  pthread_create(&this->pid_,(pthread_attr_t *)0x0,startThread,this);
  this->running_ = true;
  if ((this->joinable_ & 1U) == 0) {
    pthread_detach(this->pid_);
  }
  return;
}

Assistant:

void Thread::Start() {
  CHECK(!running_);
  pthread_create(&pid_, 0, startThread, this);
  running_ = true;
  if (!joinable_)
    pthread_detach(pid_);
}